

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListFlattenBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  reference pvVar6;
  pointer pEVar7;
  LogicalType *pLVar8;
  reference pvVar9;
  LogicalType *pLVar10;
  undefined8 *puVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  LogicalType child_type;
  LogicalType local_90;
  undefined1 local_78 [9];
  PhysicalType PStack_6f;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  if ((pEVar7->return_type).id_ == ARRAY) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    pLVar8 = ArrayType::GetChildType(&pEVar7->return_type);
    LogicalType::LogicalType(&local_90,pLVar8);
    if (local_90.id_ == ARRAY) {
      pLVar8 = ArrayType::GetChildType(&local_90);
      LogicalType::LIST((LogicalType *)(local_78 + 8),pLVar8);
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_68.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_68.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_90.id_ = local_78[8];
      local_90.physical_type_ = PStack_6f;
      LogicalType::~LogicalType((LogicalType *)(local_78 + 8));
    }
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    local_38._M_head_impl =
         (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    LogicalType::LIST((LogicalType *)(local_78 + 8),&local_90);
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)local_78,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_38,(LogicalType *)(local_78 + 8),false);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    uVar5 = local_78._0_8_;
    local_78._0_8_ = (_func_int **)0x0;
    _Var1._M_head_impl =
         (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar5;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_78._0_8_ + 8))();
    }
    local_78._0_8_ = (Expression *)0x0;
    LogicalType::~LogicalType((LogicalType *)(local_78 + 8));
    if (local_38._M_head_impl != (Expression *)0x0) {
      (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_38._M_head_impl = (Expression *)0x0;
  }
  else {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    if ((pEVar7->return_type).id_ != LIST) goto LAB_01a95d78;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    pLVar8 = ListType::GetChildType(&pEVar7->return_type);
    LogicalType::LogicalType(&local_90,pLVar8);
    if (local_90.id_ == ARRAY) {
      pLVar8 = ArrayType::GetChildType(&local_90);
      LogicalType::LIST((LogicalType *)(local_78 + 8),pLVar8);
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_68.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_68.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_90.id_ = local_78[8];
      local_90.physical_type_ = PStack_6f;
      LogicalType::~LogicalType((LogicalType *)(local_78 + 8));
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      local_40._M_head_impl =
           (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      LogicalType::LIST((LogicalType *)(local_78 + 8),&local_90);
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_78,context,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_40,(LogicalType *)(local_78 + 8),false);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      uVar5 = local_78._0_8_;
      local_78._0_8_ = (_func_int **)0x0;
      _Var1._M_head_impl =
           (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar5;
      if (_Var1._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      }
      if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_78._0_8_ + 8))();
      }
      local_78._0_8_ = (Expression *)0x0;
      LogicalType::~LogicalType((LogicalType *)(local_78 + 8));
      if (local_40._M_head_impl != (Expression *)0x0) {
        (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_40._M_head_impl = (Expression *)0x0;
    }
  }
  LogicalType::~LogicalType(&local_90);
LAB_01a95d78:
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  pLVar8 = &pEVar7->return_type;
  this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
  pvVar9 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
  if (pvVar9 != pLVar8) {
    pvVar9->id_ = (pEVar7->return_type).id_;
    pvVar9->physical_type_ = (pEVar7->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&pvVar9->type_info_,&(pEVar7->return_type).type_info_);
  }
  if (pLVar8->id_ == UNKNOWN) {
    LogicalType::LogicalType(&local_90,UNKNOWN);
    pvVar9 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
    _Var4._M_pi = local_90.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar3 = local_90.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pvVar9->id_ = local_90.id_;
    pvVar9->physical_type_ = local_90.physical_type_;
    uVar12 = *(undefined4 *)
              &(pvVar9->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar13 = *(undefined4 *)
              ((long)&(pvVar9->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar14 = *(undefined4 *)
              &(pvVar9->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar15 = *(undefined4 *)
              ((long)&(pvVar9->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (pvVar9->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_58._M_allocated_capacity._0_4_ = uVar12;
      local_58._M_allocated_capacity._4_4_ = uVar13;
      local_58._8_4_ = uVar14;
      local_58._12_4_ = uVar15;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar12 = local_58._M_allocated_capacity._0_4_;
      uVar13 = local_58._M_allocated_capacity._4_4_;
      uVar14 = local_58._8_4_;
      uVar15 = local_58._12_4_;
    }
    _Var4._M_pi = local_90.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44(uVar13,uVar12);
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         uVar15;
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         uVar14;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    LogicalType::~LogicalType(&local_90);
    LogicalType::LogicalType(&local_90,SQLNULL);
    _Var4._M_pi = local_90.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar3 = local_90.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (bound_function->super_BaseScalarFunction).return_type.id_ = local_90.id_;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_90.physical_type_;
    uVar12 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar13 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar14 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar15 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_58._M_allocated_capacity._0_4_ = uVar12;
      local_58._M_allocated_capacity._4_4_ = uVar13;
      local_58._8_4_ = uVar14;
      local_58._12_4_ = uVar15;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar12 = local_58._M_allocated_capacity._0_4_;
      uVar13 = local_58._M_allocated_capacity._4_4_;
      uVar14 = local_58._8_4_;
      uVar15 = local_58._12_4_;
    }
    _Var4._M_pi = local_90.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44(uVar13,uVar12);
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         uVar15;
    local_90.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         uVar14;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    LogicalType::~LogicalType(&local_90);
    *(undefined8 *)this = 0;
  }
  else {
    pLVar10 = ListType::GetChildType(pLVar8);
    LogicalType::LogicalType((LogicalType *)(local_78 + 8),pLVar10);
    if (local_78[8] == UNKNOWN) {
      LogicalType::LogicalType(&local_90,UNKNOWN);
      pvVar9 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
      _Var4._M_pi = local_90.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar3 = local_90.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pvVar9->id_ = local_90.id_;
      pvVar9->physical_type_ = local_90.physical_type_;
      uVar12 = *(undefined4 *)
                &(pvVar9->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar13 = *(undefined4 *)
                ((long)&(pvVar9->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar14 = *(undefined4 *)
                &(pvVar9->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar15 = *(undefined4 *)
                ((long)&(pvVar9->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pvVar9->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pvVar9->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (pvVar9->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pvVar9->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      (pvVar9->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_58._M_allocated_capacity._0_4_ = uVar12;
        local_58._M_allocated_capacity._4_4_ = uVar13;
        local_58._8_4_ = uVar14;
        local_58._12_4_ = uVar15;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        uVar12 = local_58._M_allocated_capacity._0_4_;
        uVar13 = local_58._M_allocated_capacity._4_4_;
        uVar14 = local_58._8_4_;
        uVar15 = local_58._12_4_;
      }
      _Var4._M_pi = local_90.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(uVar13,uVar12);
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = uVar15;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = uVar14;
      if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      }
      LogicalType::~LogicalType(&local_90);
      LogicalType::LogicalType(&local_90,SQLNULL);
      _Var4._M_pi = local_90.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar3 = local_90.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (bound_function->super_BaseScalarFunction).return_type.id_ = local_90.id_;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           local_90.physical_type_;
      uVar12 = *(undefined4 *)
                &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar13 = *(undefined4 *)
                ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar14 = *(undefined4 *)
                &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar15 = *(undefined4 *)
                ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_58._M_allocated_capacity._0_4_ = uVar12;
        local_58._M_allocated_capacity._4_4_ = uVar13;
        local_58._8_4_ = uVar14;
        local_58._12_4_ = uVar15;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        uVar12 = local_58._M_allocated_capacity._0_4_;
        uVar13 = local_58._M_allocated_capacity._4_4_;
        uVar14 = local_58._8_4_;
        uVar15 = local_58._12_4_;
      }
      _Var4._M_pi = local_90.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(uVar13,uVar12);
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = uVar15;
      local_90.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = uVar14;
      if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      }
      LogicalType::~LogicalType(&local_90);
      *(undefined8 *)this = 0;
      puVar11 = (undefined8 *)0x0;
    }
    else {
      pLVar10 = &(bound_function->super_BaseScalarFunction).return_type;
      if (local_78[8] == SQLNULL) {
        if (pLVar10 != pLVar8) {
          (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar7->return_type).id_;
          (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
               (pEVar7->return_type).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                     &(pEVar7->return_type).type_info_);
        }
        puVar11 = (undefined8 *)operator_new(0x20);
        LogicalType::LogicalType(&local_90,pLVar10);
      }
      else {
        if (pLVar10 != (LogicalType *)(local_78 + 8)) {
          (bound_function->super_BaseScalarFunction).return_type.id_ = local_78[8];
          (bound_function->super_BaseScalarFunction).return_type.physical_type_ = PStack_6f;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(bound_function->super_BaseScalarFunction).return_type.type_info_,&local_68);
        }
        puVar11 = (undefined8 *)operator_new(0x20);
        LogicalType::LogicalType(&local_90,pLVar10);
      }
      *puVar11 = &PTR__VariableReturnBindData_02493cb8;
      LogicalType::LogicalType((LogicalType *)(puVar11 + 1),&local_90);
      LogicalType::~LogicalType(&local_90);
    }
    *(undefined8 **)this = puVar11;
    LogicalType::~LogicalType((LogicalType *)(local_78 + 8));
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListFlattenBind(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 1);

	if (arguments[0]->return_type.id() == LogicalTypeId::ARRAY) {
		auto child_type = ArrayType::GetChildType(arguments[0]->return_type);
		if (child_type.id() == LogicalTypeId::ARRAY) {
			child_type = LogicalType::LIST(ArrayType::GetChildType(child_type));
		}
		arguments[0] =
		    BoundCastExpression::AddCastToType(context, std::move(arguments[0]), LogicalType::LIST(child_type));
	} else if (arguments[0]->return_type.id() == LogicalTypeId::LIST) {
		auto child_type = ListType::GetChildType(arguments[0]->return_type);
		if (child_type.id() == LogicalTypeId::ARRAY) {
			child_type = LogicalType::LIST(ArrayType::GetChildType(child_type));
			arguments[0] =
			    BoundCastExpression::AddCastToType(context, std::move(arguments[0]), LogicalType::LIST(child_type));
		}
	}

	auto &input_type = arguments[0]->return_type;
	bound_function.arguments[0] = input_type;
	if (input_type.id() == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalType(LogicalTypeId::UNKNOWN);
		bound_function.return_type = LogicalType(LogicalTypeId::SQLNULL);
		return nullptr;
	}
	D_ASSERT(input_type.id() == LogicalTypeId::LIST);

	auto child_type = ListType::GetChildType(input_type);
	if (child_type.id() == LogicalType::SQLNULL) {
		bound_function.return_type = input_type;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}
	if (child_type.id() == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalType(LogicalTypeId::UNKNOWN);
		bound_function.return_type = LogicalType(LogicalTypeId::SQLNULL);
		return nullptr;
	}
	D_ASSERT(child_type.id() == LogicalTypeId::LIST);

	bound_function.return_type = child_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}